

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateSwitchCases
          (CheckerVisitor *this,SwitchStatement *swtch)

{
  uint uVar1;
  SwitchCase *pSVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if ((this->effectsOnly == false) &&
     (uVar1 = (swtch->_cases)._size, uVar4 = (ulong)uVar1, 1 < (int)uVar1)) {
    uVar7 = 1;
    lVar9 = 0x10;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      uVar8 = uVar7;
      lVar10 = lVar9;
      if (uVar6 < uVar4) {
        do {
          pSVar2 = (swtch->_cases)._vals;
          bVar3 = NodeEqualChecker::check
                            ((NodeEqualChecker *)&this->field_0x20,&(pSVar2[uVar5].val)->super_Node,
                             *(Node **)((long)&pSVar2->val + lVar10));
          if (bVar3) {
            report(this,*(Node **)((long)&pSVar2->val + lVar10),0x42);
          }
          uVar8 = uVar8 + 1;
          uVar4 = (ulong)(swtch->_cases)._size;
          lVar10 = lVar10 + 0x10;
        } while (uVar8 < uVar4);
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
      uVar5 = uVar6;
    } while ((long)uVar6 < (long)((int)uVar4 + -1));
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateSwitchCases(SwitchStatement *swtch) {

  if (effectsOnly)
    return;

  const auto &cases = swtch->cases();

  for (int32_t i = 0; i < int32_t(cases.size()) - 1; ++i) {
    for (int32_t j = i + 1; j < cases.size(); ++j) {
      const auto &icase = cases[i];
      const auto &jcase = cases[j];

      if (_equalChecker.check(icase.val, jcase.val)) {
        report(jcase.val, DiagnosticsId::DI_DUPLICATE_CASE);
      }
    }
  }
}